

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMemPool.c
# Opt level: O2

deMemPool * createPoolInternal(deMemPool *parent)

{
  deMemPool *pdVar1;
  MemPage *pMVar2;
  deMemPool *pdVar3;
  deMemPoolUtil *pdVar4;
  
  pMVar2 = MemPage_create(0x80);
  if (pMVar2 == (MemPage *)0x0) {
    pdVar3 = (deMemPool *)0x0;
  }
  else {
    pMVar2->bytesAllocated = pMVar2->bytesAllocated + 0x40;
    pdVar3 = (deMemPool *)(pMVar2 + 1);
    pMVar2[1].capacity = 0;
    pMVar2[1].bytesAllocated = 0;
    pMVar2[1].nextPage = (MemPage *)0x0;
    pMVar2[2].capacity = 0;
    pMVar2[2].bytesAllocated = 0;
    pMVar2[2].nextPage = (MemPage *)0x0;
    pMVar2[4].capacity = 0;
    pMVar2[4].bytesAllocated = 0;
    pMVar2[3].capacity = 0;
    pMVar2[3].bytesAllocated = 0;
    pMVar2[3].nextPage = (MemPage *)0x0;
    pMVar2[4].nextPage = pMVar2;
    pMVar2[1].nextPage = (MemPage *)parent;
    if (parent == (deMemPool *)0x0) {
      pdVar4 = (deMemPoolUtil *)0x0;
    }
    else {
      parent->numChildren = parent->numChildren + 1;
      pdVar1 = parent->firstChild;
      if (pdVar1 != (deMemPool *)0x0) {
        pdVar1->prevPool = pdVar3;
      }
      *(deMemPool **)(pMVar2 + 4) = pdVar1;
      parent->firstChild = pdVar3;
      pdVar4 = parent->util;
    }
    *(deMemPoolUtil **)(pMVar2 + 2) = pdVar4;
  }
  return pdVar3;
}

Assistant:

static deMemPool* createPoolInternal (deMemPool* parent)
{
	deMemPool*	pool;
	MemPage*	initialPage;

#if defined(DE_SUPPORT_FAILING_POOL_ALLOC)
	if (parent && parent->allowFailing)
	{
		if ((deRandom_getUint32(&parent->failRandom) & 16383) <= 15)
			return DE_NULL;
	}
#endif

	/* Init first page. */
	initialPage = MemPage_create(INITIAL_PAGE_SIZE);
	if (!initialPage)
		return DE_NULL;

	/* Alloc pool from initial page. */
	DE_ASSERT((int)sizeof(deMemPool) <= initialPage->capacity);
	pool = (deMemPool*)(initialPage + 1);
	initialPage->bytesAllocated += (int)sizeof(deMemPool);

	memset(pool, 0, sizeof(deMemPool));
	pool->currentPage = initialPage;

	/* Register to parent. */
	pool->parent = parent;
	if (parent)
	{
		parent->numChildren++;
		if (parent->firstChild) parent->firstChild->prevPool = pool;
		pool->nextPool = parent->firstChild;
		parent->firstChild = pool;
	}

	/* Get utils from parent. */
	pool->util = parent ? parent->util : DE_NULL;

#if defined(DE_SUPPORT_FAILING_POOL_ALLOC)
	pool->allowFailing = parent ? parent->allowFailing : DE_FALSE;
	deRandom_init(&pool->failRandom, parent ? deRandom_getUint32(&parent->failRandom) : 0x1234abcd);
#endif

#if defined(DE_SUPPORT_DEBUG_POOLS)
	pool->enableDebugAllocs		= parent ? parent->enableDebugAllocs : DE_FALSE;
	pool->debugAllocListHead	= DE_NULL;

	/* Pool allocation index. */
	{
		deMemPool* root = pool;
		while (root->parent)
			root = root->parent;

		if (pool == root)
			root->lastAllocatedIndex = 0;

		pool->allocIndex = ++root->lastAllocatedIndex;

		/* \note Put the index of leaking pool here and add a breakpoint to catch leaks easily. */
/*		if (pool->allocIndex == 51)
			root = root;*/
	}
#endif

	return pool;
}